

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O1

ImPlotTick * __thiscall
ImPlotTickCollection::Append
          (ImPlotTickCollection *this,double value,bool major,bool show_label,char *fmt)

{
  int iVar1;
  size_t sVar2;
  ImPlotTick *pIVar3;
  ImVec2 IVar4;
  ImPlotTick tick;
  char temp [32];
  ImPlotTick local_58;
  char local_38;
  char acStack_37 [31];
  
  local_58.LabelSize.y = 0.0;
  local_58.TextOffset = -1;
  local_58.LabelSize.x = 0.0;
  local_58.Level = 0;
  local_58.PlotPos = value;
  local_58.Major = major;
  local_58.ShowLabel = show_label;
  if (fmt != (char *)0x0 && show_label) {
    iVar1 = (this->TextBuffer).Buf.Size;
    local_58.TextOffset = iVar1 + -1;
    if (iVar1 == 0) {
      local_58.TextOffset = 0;
    }
    snprintf(&local_38,0x20,fmt);
    sVar2 = strlen(&local_38);
    ImGuiTextBuffer::append(&this->TextBuffer,&local_38,acStack_37 + sVar2);
    IVar4 = ImGui::CalcTextSize((this->TextBuffer).Buf.Data + local_58.TextOffset,(char *)0x0,false,
                                -1.0);
    local_58.LabelSize.x = IVar4.x;
    local_58.LabelSize.y = IVar4.y;
  }
  pIVar3 = Append(this,&local_58);
  return pIVar3;
}

Assistant:

const ImPlotTick& Append(double value, bool major, bool show_label, const char* fmt) {
        ImPlotTick tick(value, major, show_label);
        if (show_label && fmt != NULL) {
            char temp[32];
            tick.TextOffset = TextBuffer.size();
            snprintf(temp, 32, fmt, tick.PlotPos);
            TextBuffer.append(temp, temp + strlen(temp) + 1);
            tick.LabelSize = ImGui::CalcTextSize(TextBuffer.Buf.Data + tick.TextOffset);
        }
        return Append(tick);
    }